

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

void lj_cconv_bf_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o)

{
  uint8_t uVar1;
  ulong in_RAX;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uStack_28;
  uint8_t tmpbool;
  uint local_24;
  
  uVar4 = d->info;
  _uStack_28 = in_RAX;
  if ((uVar4 >> 0x1b & 1) == 0) {
    lj_cconv_ct_tv(cts,(CType *)((long)&cts->tab->info +
                                (ulong)((((uVar4 >> 0x17 & 1) != 0) + 9) * 0x10)),
                   (uint8_t *)&stack0xffffffffffffffdc,o,0);
  }
  else {
    lj_cconv_ct_tv(cts,cts->tab + 3,&tmpbool,o,0);
    uVar1 = tmpbool;
    _uStack_28 = (ulong)CONCAT14(uVar1,uStack_28);
  }
  uVar3 = uVar4 >> 8 & 0x7f;
  uVar6 = uVar4 >> 0x10 & 0x7f;
  if (uVar3 + (uVar4 & 0x7f) <= uVar6 * 8) {
    uVar3 = ~(-1 << ((byte)uVar3 & 0x1f));
    bVar2 = (byte)(uVar4 & 0x7f);
    uVar5 = uVar3 << (bVar2 & 0x1f);
    uVar4 = (uVar3 & local_24) << (bVar2 & 0x1f);
    if (uVar6 == 1) {
      *dp = ~(byte)uVar5 & *dp | (byte)uVar4;
    }
    else if (uVar6 == 2) {
      *(ushort *)dp = ~(ushort)uVar5 & *(ushort *)dp | (ushort)uVar4;
    }
    else if (uVar6 == 4) {
      *(uint *)dp = ~uVar5 & *(uint *)dp | uVar4;
    }
    return;
  }
  lj_err_caller(cts->L,LJ_ERR_FFI_NYIPACKBIT);
}

Assistant:

void lj_cconv_bf_tv(CTState *cts, CType *d, uint8_t *dp, TValue *o)
{
  CTInfo info = d->info;
  CTSize pos, bsz;
  uint32_t val, mask;
  lua_assert(ctype_isbitfield(info));
  if ((info & CTF_BOOL)) {
    uint8_t tmpbool;
    lua_assert(ctype_bitbsz(info) == 1);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_BOOL), &tmpbool, o, 0);
    val = tmpbool;
  } else {
    CTypeID did = (info & CTF_UNSIGNED) ? CTID_UINT32 : CTID_INT32;
    lj_cconv_ct_tv(cts, ctype_get(cts, did), (uint8_t *)&val, o, 0);
  }
  pos = ctype_bitpos(info);
  bsz = ctype_bitbsz(info);
  lua_assert(pos < 8*ctype_bitcsz(info));
  lua_assert(bsz > 0 && bsz <= 8*ctype_bitcsz(info));
  /* Check if a packed bitfield crosses a container boundary. */
  if (pos + bsz > 8*ctype_bitcsz(info))
    lj_err_caller(cts->L, LJ_ERR_FFI_NYIPACKBIT);
  mask = ((1u << bsz) - 1u) << pos;
  val = (val << pos) & mask;
  /* NYI: packed bitfields may cause misaligned reads/writes. */
  switch (ctype_bitcsz(info)) {
  case 4: *(uint32_t *)dp = (*(uint32_t *)dp & ~mask) | (uint32_t)val; break;
  case 2: *(uint16_t *)dp = (*(uint16_t *)dp & ~mask) | (uint16_t)val; break;
  case 1: *(uint8_t *)dp = (*(uint8_t *)dp & ~mask) | (uint8_t)val; break;
  default: lua_assert(0); break;
  }
}